

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetMuxLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj_00;
  
  iVar2 = Gia_ObjIsMux(p,pObj);
  if (iVar2 != 0) {
    iVar3 = Gia_ObjLevel(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    iVar2 = Gia_ObjLevel(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    puVar1 = p->pMuxes;
    if (puVar1 == (uint *)0x0) {
      pObj_00 = (Gia_Obj_t *)0x0;
    }
    else {
      iVar4 = Gia_ObjId(p,pObj);
      iVar4 = Abc_Lit2Var(puVar1[iVar4]);
      pObj_00 = Gia_ManObj(p,iVar4);
    }
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = Gia_ObjLevel(p,pObj_00);
    if (iVar2 <= iVar3) {
      iVar2 = iVar3;
    }
    Gia_ObjSetLevel(p,pObj,iVar2 + 2);
    return;
  }
  __assert_fail("Gia_ObjIsMux(p,pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x243,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetMuxLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsMux(p,pObj) ); Gia_ObjSetLevel( p, pObj, 2+Abc_MaxInt( Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))), Gia_ObjLevel(p,Gia_ObjFanin2(p,pObj))) ); }